

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bocsu.cpp
# Opt level: O0

UChar32 u_writeIdenticalLevelRun_63(UChar32 prev,UChar *s,int32_t length,ByteSink *sink)

{
  long lVar1;
  int iVar2;
  uint local_8c;
  uint16_t __c2;
  UChar32 c;
  uint8_t *lastSafe;
  uint8_t *p;
  char *buffer;
  int32_t i;
  int32_t capacity;
  char scratch [64];
  ByteSink *sink_local;
  int32_t length_local;
  UChar *s_local;
  UChar32 prev_local;
  
  buffer._0_4_ = 0;
  scratch._56_8_ = sink;
  s_local._4_4_ = prev;
  while ((int)buffer < length) {
    p = (uint8_t *)
        (**(code **)(*(long *)scratch._56_8_ + 0x18))
                  (scratch._56_8_,1,length << 1,&i,0x40,(long)&buffer + 4);
    if (buffer._4_4_ < 0x10) {
      p = (uint8_t *)&i;
      buffer._4_4_ = 0x40;
    }
    lastSafe = p;
    lVar1 = (long)buffer._4_4_;
    while ((int)buffer < length && lastSafe <= p + lVar1 + -4) {
      if (((int)s_local._4_4_ < 0x4e00) || (0x9fff < (int)s_local._4_4_)) {
        s_local._4_4_ = (s_local._4_4_ & 0xffffff80) + 0x50;
      }
      else {
        s_local._4_4_ = 0x7654;
      }
      iVar2 = (int)buffer + 1;
      local_8c = (uint)(ushort)s[(int)buffer];
      if ((((local_8c & 0xfffffc00) == 0xd800) && (iVar2 != length)) &&
         ((s[iVar2] & 0xfc00U) == 0xdc00)) {
        local_8c = local_8c * 0x400 + (uint)(ushort)s[iVar2] + 0xfca02400;
        iVar2 = (int)buffer + 2;
      }
      buffer._0_4_ = iVar2;
      if (local_8c == 0xfffe) {
        *lastSafe = '\x02';
        s_local._4_4_ = 0;
        lastSafe = lastSafe + 1;
      }
      else {
        lastSafe = u_writeDiff(local_8c - s_local._4_4_,lastSafe);
        s_local._4_4_ = local_8c;
      }
    }
    (**(code **)(*(long *)scratch._56_8_ + 0x10))(scratch._56_8_,p,(int)lastSafe - (int)p);
  }
  return s_local._4_4_;
}

Assistant:

U_CFUNC UChar32
u_writeIdenticalLevelRun(UChar32 prev, const UChar *s, int32_t length, icu::ByteSink &sink) {
    char scratch[64];
    int32_t capacity;

    int32_t i=0;
    while(i<length) {
        char *buffer=sink.GetAppendBuffer(1, length*2, scratch, (int32_t)sizeof(scratch), &capacity);
        uint8_t *p;
        // We must have capacity>=SLOPE_MAX_BYTES in case u_writeDiff() writes that much,
        // but we do not want to force the sink.GetAppendBuffer() to allocate
        // for a large min_capacity because we might actually only write one byte.
        if(capacity<16) {
            buffer=scratch;
            capacity=(int32_t)sizeof(scratch);
        }
        p=reinterpret_cast<uint8_t *>(buffer);
        uint8_t *lastSafe=p+capacity-SLOPE_MAX_BYTES;
        while(i<length && p<=lastSafe) {
            if(prev<0x4e00 || prev>=0xa000) {
                prev=(prev&~0x7f)-SLOPE_REACH_NEG_1;
            } else {
                /*
                 * Unihan U+4e00..U+9fa5:
                 * double-bytes down from the upper end
                 */
                prev=0x9fff-SLOPE_REACH_POS_2;
            }

            UChar32 c;
            U16_NEXT(s, i, length, c);
            if(c==0xfffe) {
                *p++=2;  // merge separator
                prev=0;
            } else {
                p=u_writeDiff(c-prev, p);
                prev=c;
            }
        }
        sink.Append(buffer, (int32_t)(p-reinterpret_cast<uint8_t *>(buffer)));
    }
    return prev;
}